

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

void __thiscall google::protobuf::io::Printer::push_back(Printer *this,char c)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  char *in_RAX;
  void *void_buffer;
  char *local_28;
  
  if (this->failed_ == false) {
    if (this->buffer_size_ == 0) {
      local_28 = in_RAX;
      do {
        iVar3 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                          (this->output_,&local_28,&this->buffer_size_);
        bVar2 = (byte)iVar3;
        if (bVar2 == 0) {
          this->failed_ = true;
        }
        else {
          this->buffer_ = local_28;
        }
      } while ((bVar2 & this->buffer_size_ == 0) != 0);
      if (bVar2 == 0) {
        return;
      }
    }
    pcVar1 = this->buffer_;
    this->buffer_ = pcVar1 + 1;
    *pcVar1 = c;
    this->buffer_size_ = this->buffer_size_ + -1;
    this->offset_ = this->offset_ + 1;
  }
  return;
}

Assistant:

void push_back(char c) {
    if (failed_) return;
    if (buffer_size_ == 0) {
      if (!Next()) return;
    }
    *buffer_++ = c;
    buffer_size_--;
    offset_++;
  }